

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O2

void __thiscall
SparseArray<float,_512UL>::SparseArray(SparseArray<float,_512UL> *this,HaU32 maxEntries)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  size_t i;
  long lVar3;
  HashEntry *pHVar4;
  HashEntry *pHVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  
  this->mFreeList = (HashEntry *)0x0;
  this->mHashTableCount = 0;
  for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
    this->mHashTable[lVar3] = (HashEntry *)0x0;
  }
  this->mMaxEntries = maxEntries;
  pHVar4 = (HashEntry *)malloc((ulong)maxEntries << 4);
  if (maxEntries != 0) {
    auVar7 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar1 = vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    uVar6 = (ulong)maxEntries + 0xfffffffffffffff;
    auVar8 = vpbroadcastq_avx512f();
    lVar3 = 0;
    pHVar5 = pHVar4;
    do {
      auVar9 = vpbroadcastq_avx512f();
      lVar3 = lVar3 + 8;
      auVar9 = vporq_avx512f(auVar9,auVar7);
      uVar2 = vpcmpuq_avx512f(auVar9,auVar8,2);
      vpscatterdq_avx512f(ZEXT864(pHVar5) + ZEXT3264(auVar1),uVar2,ZEXT1664((undefined1  [16])0x0));
      pHVar5 = pHVar5 + 8;
    } while (((uVar6 & 0xfffffffffffffff) + 8) - (ulong)((uint)uVar6 & 7) != lVar3);
  }
  this->mEntries = pHVar4;
  return;
}

Assistant:

SparseArray(HaU32 maxEntries)
	{
		mFreeList = NULL;
		mHashTableCount = 0;
		for (size_t i = 0; i < hashTableSize; i++)
		{
			mHashTable[i] = NULL;
		}
		mMaxEntries = maxEntries;
		mEntries = HACD_NEW(HashEntry)[maxEntries];
	}